

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreplay.h
# Opt level: O3

base_learner *
ExpReplay::expreplay_setup<(char)109,MULTICLASS::mc_label>(options_i *options,vw *all)

{
  undefined4 uVar1;
  size_t count;
  long lVar2;
  _func_int **pp_Var3;
  int iVar4;
  expreplay *__ptr;
  _func_int ***__dest;
  option_group_definition *this;
  typed_option<unsigned_long> *op;
  long *__dest_00;
  example *peVar5;
  bool *pbVar6;
  ostream *poVar7;
  base_learner *l;
  single_learner *__src;
  learner<ExpReplay::expreplay,_example> *__dest_01;
  string replay_string;
  string replay_count_string;
  size_type __dnew_2;
  option_group_definition new_options;
  size_type __dnew;
  size_type __dnew_1;
  undefined4 *local_298;
  long local_290;
  undefined4 local_288;
  undefined3 uStack_284;
  undefined1 local_281;
  _func_int ***local_278;
  _func_int **local_270;
  _func_int **local_268 [2];
  undefined1 *local_258;
  long local_250;
  undefined1 local_248 [16];
  size_t *local_238;
  long local_230;
  long *local_228;
  long local_220;
  long local_218 [2];
  string local_208;
  _func_int ***local_1e8;
  _func_int **local_1e0;
  _func_int **local_1d8 [2];
  string local_1c8;
  option_group_definition local_1a8;
  undefined1 local_170 [112];
  bool local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  typed_option<unsigned_long> local_d0;
  
  local_298 = &local_288;
  local_288 = 0x6c706572;
  uStack_284 = 0x5f7961;
  local_290 = 7;
  local_281 = 0;
  std::__cxx11::string::push_back((char)&local_298);
  local_258 = local_248;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,local_298,local_290 + (long)local_298);
  std::__cxx11::string::append((char *)&local_258);
  __ptr = calloc_or_throw<ExpReplay::expreplay>(1);
  __ptr->replay_count = 0;
  __ptr->base = (single_learner *)0x0;
  __ptr->buf = (example *)0x0;
  __ptr->filled = (bool *)0x0;
  __ptr->all = (vw *)0x0;
  __ptr->N = 0;
  local_170._0_8_ = (_func_int **)0x11;
  local_278 = local_268;
  local_278 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_278,(ulong)local_170);
  local_268[0] = (_func_int **)local_170._0_8_;
  *(undefined4 *)local_278 = 0x65707845;
  builtin_strncpy((char *)((long)local_278 + 4),"rien",4);
  *(undefined4 *)(local_278 + 1) = 0x52206563;
  builtin_strncpy((char *)((long)local_278 + 0xc),"epla",4);
  *(char *)(local_278 + 2) = 'y';
  local_270 = (_func_int **)local_170._0_8_;
  *(char *)((long)local_278 + local_170._0_8_) = '\0';
  local_1a8.m_name._M_dataplus._M_p = (pointer)&local_1a8.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,local_278,(char *)(local_170._0_8_ + (long)local_278));
  local_1a8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_278 != local_268) {
    operator_delete(local_278);
  }
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_298,local_290 + (long)local_298);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_170,&local_1c8,&__ptr->N);
  local_100 = true;
  local_1e8 = local_1d8;
  local_d0.super_base_option._vptr_base_option = (_func_int **)0x83;
  __dest = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_1e8,(ulong)&local_d0);
  pp_Var3 = local_d0.super_base_option._vptr_base_option;
  local_1d8[0] = local_d0.super_base_option._vptr_base_option;
  local_1e8 = __dest;
  memcpy(__dest,
         "use experience replay at a specified level [b=classification/regression, m=multiclass, c=cost sensitive] with specified buffer size"
         ,0x83);
  local_1e0 = pp_Var3;
  *(undefined1 *)((long)__dest + (long)pp_Var3) = 0;
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  this = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                   (&local_1a8,(typed_option<unsigned_long> *)local_170);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_208,local_258,local_258 + local_250);
  VW::config::typed_option<unsigned_long>::typed_option(&local_d0,&local_208,&__ptr->replay_count);
  op = VW::config::typed_option<unsigned_long>::default_value(&local_d0,1);
  local_228 = local_218;
  local_230 = 0x56;
  local_238 = &__ptr->replay_count;
  __dest_00 = (long *)std::__cxx11::string::_M_create((ulong *)&local_228,(ulong)&local_230);
  lVar2 = local_230;
  local_218[0] = local_230;
  local_228 = __dest_00;
  memcpy(__dest_00,
         "how many times (in expectation) should each example be played (default: 1 = permuting)",
         0x56);
  local_220 = lVar2;
  *(undefined1 *)((long)__dest_00 + lVar2) = 0;
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>(this,op);
  if (local_228 != local_218) {
    operator_delete(local_228);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002da208;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  local_170._0_8_ = &PTR__typed_option_002da208;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_1a8);
  iVar4 = (*options->_vptr_options_i[1])(options,&local_298);
  if (((char)iVar4 == '\0') || (count = __ptr->N, count == 0)) {
    __dest_01 = (learner<ExpReplay::expreplay,_example> *)0x0;
  }
  else {
    __ptr->all = all;
    peVar5 = VW::alloc_examples(1,count);
    __ptr->buf = peVar5;
    pbVar6 = calloc_or_throw<bool>(__ptr->N);
    __ptr->filled = pbVar6;
    if (all->quiet == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"experience replay level=",0x18);
      local_170[0] = 0x6d;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_170,1)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", buffer=",9);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", replay count=",0xf);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    l = setup_base(options,all);
    __src = LEARNER::as_singleline<char,char>(l);
    __ptr->base = __src;
    uVar1 = *(undefined4 *)(__src + 0xd0);
    __dest_01 = calloc_or_throw<LEARNER::learner<ExpReplay::expreplay,example>>(1);
    memcpy(__dest_01,__src,0xe9);
    *(single_learner **)(__dest_01 + 0x20) = __src;
    *(code **)(__dest_01 + 0x50) = LEARNER::recur_sensitivity;
    *(expreplay **)(__dest_01 + 0xb8) = __ptr;
    *(single_learner **)(__dest_01 + 0xc0) = __src;
    *(code **)(__dest_01 + 200) = LEARNER::noop;
    *(undefined8 *)(__dest_01 + 0xd8) = 1;
    *(undefined8 *)(__dest_01 + 0xe0) = *(undefined8 *)(__src + 0xe0);
    *(expreplay **)(__dest_01 + 0x18) = __ptr;
    *(code **)(__dest_01 + 0x28) = predict_or_learn<true,MULTICLASS::mc_label>;
    *(code **)(__dest_01 + 0x38) = predict_or_learn<true,MULTICLASS::mc_label>;
    *(code **)(__dest_01 + 0x30) = predict_or_learn<false,MULTICLASS::mc_label>;
    *(undefined8 *)(__dest_01 + 0x40) = 0;
    *(undefined4 *)(__dest_01 + 0xd0) = uVar1;
    __dest_01[0xe8] = (learner<ExpReplay::expreplay,_example>)0x0;
    *(expreplay **)(__dest_01 + 0xb8) = __ptr;
    *(single_learner **)(__dest_01 + 0xc0) = __src;
    *(code **)(__dest_01 + 200) = finish<MULTICLASS::mc_label>;
    *(expreplay **)(__dest_01 + 0x88) = __ptr;
    *(single_learner **)(__dest_01 + 0x90) = __src;
    *(code **)(__dest_01 + 0x98) = end_pass;
    __ptr = (expreplay *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_1a8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8.m_name._M_dataplus._M_p != &local_1a8.m_name.field_2) {
    operator_delete(local_1a8.m_name._M_dataplus._M_p);
  }
  if (__ptr != (expreplay *)0x0) {
    free(__ptr);
  }
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  if (local_298 != &local_288) {
    operator_delete(local_298);
  }
  return (base_learner *)__dest_01;
}

Assistant:

LEARNER::base_learner* expreplay_setup(VW::config::options_i& options, vw& all)
{
  std::string replay_string = "replay_";
  replay_string += er_level;
  std::string replay_count_string = replay_string;
  replay_count_string += "_count";

  auto er = scoped_calloc_or_throw<expreplay>();
  VW::config::option_group_definition new_options("Experience Replay");
  new_options
      .add(VW::config::make_option(replay_string, er->N)
               .keep()
               .help("use experience replay at a specified level [b=classification/regression, m=multiclass, c=cost "
                     "sensitive] with specified buffer size"))
      .add(VW::config::make_option(replay_count_string, er->replay_count)
               .default_value(1)
               .help("how many times (in expectation) should each example be played (default: 1 = permuting)"));
  options.add_and_parse(new_options);

  if (!options.was_supplied(replay_string) || er->N == 0)
    return nullptr;

  er->all = &all;
  er->buf = VW::alloc_examples(1, er->N);

  if (er_level == 'c')
    for (size_t n = 0; n < er->N; n++) er->buf[n].l.cs.costs = v_init<COST_SENSITIVE::wclass>();

  er->filled = calloc_or_throw<bool>(er->N);

  if (!all.quiet)
    std::cerr << "experience replay level=" << er_level << ", buffer=" << er->N << ", replay count=" << er->replay_count
              << std::endl;

  er->base = LEARNER::as_singleline(setup_base(options, all));
  LEARNER::learner<expreplay, example>* l =
      &init_learner(er, er->base, predict_or_learn<true, lp>, predict_or_learn<false, lp>);
  l->set_finish(finish<lp>);
  l->set_end_pass(end_pass);

  return make_base(*l);
}